

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definitions.h
# Opt level: O0

float RVO::distSqPointLineSegment(Vector2 *a,Vector2 *b,Vector2 *c)

{
  Vector2 *this;
  Vector2 *this_00;
  float fVar1;
  float fVar2;
  Vector2 local_74;
  Vector2 local_6c;
  Vector2 local_64;
  Vector2 local_5c;
  Vector2 local_54;
  Vector2 local_4c;
  Vector2 local_44;
  Vector2 local_3c;
  Vector2 local_34;
  float local_2c;
  Vector2 *pVStack_28;
  float r;
  Vector2 *c_local;
  Vector2 *b_local;
  Vector2 *a_local;
  
  pVStack_28 = c;
  c_local = b;
  b_local = a;
  local_34 = Vector2::operator-(c,a);
  local_3c = Vector2::operator-(c_local,b_local);
  fVar1 = Vector2::operator*(&local_34,&local_3c);
  local_44 = Vector2::operator-(c_local,b_local);
  fVar2 = absSq(&local_44);
  this_00 = b_local;
  this = pVStack_28;
  fVar1 = fVar1 / fVar2;
  local_2c = fVar1;
  if (0.0 <= fVar1) {
    if (fVar1 <= 1.0) {
      local_74 = Vector2::operator-(c_local,b_local);
      local_6c = operator*(fVar1,&local_74);
      local_64 = Vector2::operator+(this_00,&local_6c);
      local_5c = Vector2::operator-(this,&local_64);
      a_local._4_4_ = absSq(&local_5c);
    }
    else {
      local_54 = Vector2::operator-(pVStack_28,c_local);
      a_local._4_4_ = absSq(&local_54);
    }
  }
  else {
    local_4c = Vector2::operator-(pVStack_28,b_local);
    a_local._4_4_ = absSq(&local_4c);
  }
  return a_local._4_4_;
}

Assistant:

inline float distSqPointLineSegment(const Vector2 &a, const Vector2 &b,
										const Vector2 &c)
	{
		const float r = ((c - a) * (b - a)) / absSq(b - a);

		if (r < 0.0f) {
			return absSq(c - a);
		}
		else if (r > 1.0f) {
			return absSq(c - b);
		}
		else {
			return absSq(c - (a + r * (b - a)));
		}
	}